

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O2

void __thiscall
QOpenGLShaderProgram::setAttributeValue(QOpenGLShaderProgram *this,int location,QColor *value)

{
  long lVar1;
  long in_FS_OFFSET;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (location != -1) {
    lVar1 = *(long *)&this->field_0x8;
    local_38 = QColor::redF();
    local_34 = QColor::greenF();
    local_30 = QColor::blueF();
    local_2c = QColor::alphaF();
    (**(code **)(**(long **)(lVar1 + 0xd0) + 0x460))(location,&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLShaderProgram::setAttributeValue(int location, const QColor& value)
{
    Q_D(QOpenGLShaderProgram);
    Q_UNUSED(d);
    if (location != -1) {
        GLfloat values[4] = {GLfloat(value.redF()), GLfloat(value.greenF()),
                             GLfloat(value.blueF()), GLfloat(value.alphaF())};
        d->glfuncs->glVertexAttrib4fv(location, values);
    }
}